

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_zip_ZipReader.cpp
# Opt level: O0

bool __thiscall axl::zip::ZipReader::openMem(ZipReader *this,void *p,size_t size)

{
  mz_bool mVar1;
  mz_zip_archive_tag *pmVar2;
  int in_ESI;
  ZipReader *in_RDI;
  mz_bool result;
  ZeroInit_t *in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffff90;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  bool bVar3;
  uint in_stack_ffffffffffffffbc;
  ErrorRef *in_stack_ffffffffffffffc0;
  
  close(in_RDI,in_ESI);
  pmVar2 = (mz_zip_archive_tag *)
           operator_new((size_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  in_RDI->m_zip = pmVar2;
  mVar1 = mz_zip_reader_init_mem
                    ((mz_zip_archive *)
                     CONCAT17(in_stack_ffffffffffffff9f,
                              CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)),
                     in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88,0);
  in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc & 0xffffff;
  if (mVar1 == 0) {
    err::ErrorRef::ErrorRef(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    in_stack_ffffffffffffffbc = 0x1000000;
    bVar3 = err::fail((ErrorRef *)0x1697b2);
  }
  else {
    bVar3 = true;
  }
  if ((in_stack_ffffffffffffffbc & 0x1000000) != 0) {
    err::ErrorRef::~ErrorRef((ErrorRef *)0x1697df);
  }
  return bVar3;
}

Assistant:

bool
ZipReader::openMem(
	const void* p,
	size_t size
) {
	close();

	m_zip = new (mem::ZeroInit) mz_zip_archive;
	mz_bool result = mz_zip_reader_init_mem(m_zip, p, size, MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY);
	return result ? true : err::fail(err::SystemErrorCode_Unsuccessful);
}